

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

void __thiscall
boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>::
init_from_string<char,std::char_traits<char>,std::allocator<char>>
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,size_type pos,
          size_type n,size_type num_bits)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  unsigned_long *puVar4;
  ctype *pcVar5;
  char_type *pcVar6;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  ctype<char> *in_R8;
  char c;
  size_type i;
  size_type m;
  char one;
  ctype<char> *fac;
  size_type sz;
  size_type rlen;
  char in_stack_ffffffffffffff57;
  bool val;
  ctype<char> *in_stack_ffffffffffffff58;
  ctype<char> *pcVar7;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_type in_stack_ffffffffffffff68;
  char_type local_72;
  char_type local_71;
  ctype<char> *local_70;
  ctype<char> *local_68;
  char_type local_5d [13];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  ctype<char> *local_30;
  ctype<char> *local_28;
  unsigned_long local_20;
  ulong local_18;
  ulong local_10;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < in_RDX) {
    __assert_fail("pos <= s.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                  ,0x170,
                  "void boost::dynamic_bitset<>::init_from_string(const std::basic_string<CharT, Traits, Alloc> &, typename std::basic_string<CharT, Traits, Alloc>::size_type, typename std::basic_string<CharT, Traits, Alloc>::size_type, size_type) [Block = unsigned long, Allocator = std::allocator<unsigned long>, CharT = char, Traits = std::char_traits<char>, Alloc = std::allocator<char>]"
                 );
  }
  lVar3 = std::__cxx11::string::size();
  local_50.m_num_bits = lVar3 - local_18;
  puVar4 = std::min<unsigned_long>(&local_20,&local_50.m_num_bits);
  local_30 = (ctype<char> *)*puVar4;
  pcVar7 = local_30;
  if (local_28 != (ctype<char> *)0xffffffffffffffff) {
    pcVar7 = local_28;
  }
  local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pcVar7;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::calc_num_blocks((size_type)pcVar7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pcVar7,
             in_stack_ffffffffffffff68);
  *(pointer *)(in_RDI + 0x18) =
       local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  this_00 = &local_50;
  std::locale::locale((locale *)this_00);
  pcVar5 = std::use_facet<std::ctype<char>>((locale *)this_00);
  std::locale::~locale((locale *)&local_50);
  local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pcVar5;
  local_5d[0] = std::ctype<char>::widen(in_stack_ffffffffffffff58,in_stack_ffffffffffffff57);
  pcVar7 = local_30;
  if (local_28 < local_30) {
    pcVar7 = local_28;
  }
  local_70 = (ctype<char> *)0x0;
  local_68 = pcVar7;
  while( true ) {
    if (local_68 <= local_70) {
      return;
    }
    pcVar6 = (char_type *)std::__cxx11::string::operator[](local_10);
    local_71 = *pcVar6;
    bVar1 = std::char_traits<char>::eq(&local_71,local_5d);
    val = true;
    if (!bVar1) {
      local_72 = std::ctype<char>::widen(pcVar7,'\x01');
      val = std::char_traits<char>::eq(&local_71,&local_72);
    }
    if (val == false) break;
    bVar1 = std::char_traits<char>::eq(&local_71,local_5d);
    if (bVar1) {
      dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                (this_00,(size_type)pcVar7,val);
    }
    local_70 = local_70 + 1;
  }
  __assert_fail("Tr::eq(c, one) || Tr::eq(c, BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, \'0\'))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x185,
                "void boost::dynamic_bitset<>::init_from_string(const std::basic_string<CharT, Traits, Alloc> &, typename std::basic_string<CharT, Traits, Alloc>::size_type, typename std::basic_string<CharT, Traits, Alloc>::size_type, size_type) [Block = unsigned long, Allocator = std::allocator<unsigned long>, CharT = char, Traits = std::char_traits<char>, Alloc = std::allocator<char>]"
               );
}

Assistant:

void init_from_string(const std::basic_string<CharT, Traits, Alloc>& s,
        typename std::basic_string<CharT, Traits, Alloc>::size_type pos,
        typename std::basic_string<CharT, Traits, Alloc>::size_type n,
        size_type num_bits)
    {
        assert(pos <= s.size());

        typedef typename std::basic_string<CharT, Traits, Alloc> StrT;
        typedef typename StrT::traits_type Tr;

        const typename StrT::size_type rlen = (std::min)(n, s.size() - pos);
        const size_type sz = ( num_bits != npos? num_bits : rlen);
        m_bits.resize(calc_num_blocks(sz));
        m_num_bits = sz;


        BOOST_DYNAMIC_BITSET_CTYPE_FACET(CharT, fac, std::locale());
        const CharT one = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

        const size_type m = num_bits < rlen ? num_bits : rlen;
        typename StrT::size_type i = 0;
        for( ; i < m; ++i) {

            const CharT c = s[(pos + m - 1) - i];

            assert( Tr::eq(c, one)
                    || Tr::eq(c, BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0')) );

            if (Tr::eq(c, one))
                set(i);

        }

    }